

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuilderTask.cpp
# Opt level: O1

ExecutionResult __thiscall
nigel::BuilderTask::execute
          (BuilderTask *this,
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
          *parameters,set<char,_std::less<char>,_std::allocator<char>_> *flags)

{
  _Rb_tree_header *p_Var1;
  list<std::shared_ptr<nigel::BuilderExecutable>,_std::allocator<std::shared_ptr<nigel::BuilderExecutable>_>_>
  *plVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  long *plVar4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  key_type *pkVar5;
  int iVar6;
  ExecutionResult EVar7;
  rep rVar8;
  iterator iVar9;
  mapped_type *pmVar10;
  ExecutionResult EVar11;
  _List_node_base *p_Var12;
  bool bVar13;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Db;
  list<std::shared_ptr<nigel::CompileNotification>,_std::allocator<std::shared_ptr<nigel::CompileNotification>_>_>
  notificationList;
  CodeBase codeBase;
  undefined1 local_169;
  key_type local_168;
  key_type local_140;
  BuilderTask *local_120;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_118;
  _List_base<std::shared_ptr<nigel::CompileNotification>,_std::allocator<std::shared_ptr<nigel::CompileNotification>_>_>
  local_110;
  path *local_f8;
  key_type *pkStack_f0;
  pointer local_e8;
  key_type *pkStack_e0;
  undefined4 local_d8;
  undefined1 local_d4 [8];
  undefined4 uStack_cc;
  undefined4 uStack_c8;
  undefined4 uStack_c4;
  undefined8 uStack_c0;
  _List_base<std::shared_ptr<nigel::Token>,_std::allocator<std::shared_ptr<nigel::Token>_>_>
  local_b8;
  undefined8 uStack_a0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_98;
  _List_base<std::shared_ptr<nigel::IM_Command>,_std::allocator<std::shared_ptr<nigel::IM_Command>_>_>
  local_90;
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_std::shared_ptr<nigel::IM_Variable>_>,_std::_Select1st<std::pair<const_unsigned_int,_std::shared_ptr<nigel::IM_Variable>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::shared_ptr<nigel::IM_Variable>_>_>_>
  local_78;
  void *pvStack_48;
  undefined8 local_40;
  long lStack_38;
  
  local_b8._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&local_b8;
  local_e8 = (pointer)0x0;
  pkStack_e0 = (key_type *)0x0;
  local_f8 = (path *)0x0;
  pkStack_f0 = (key_type *)0x0;
  local_d8 = 1;
  local_d4 = (undefined1  [8])0x0;
  uStack_cc = 0;
  uStack_c8 = 0;
  uStack_c4 = 0;
  uStack_c0 = 0;
  local_90._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&local_90;
  local_b8._M_impl._M_node._M_size = 0;
  uStack_a0 = 0;
  local_98 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_90._M_impl._M_node._M_size = 0;
  local_78._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_78._M_impl.super__Rb_tree_header._M_header;
  local_78._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_78._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_78._M_impl.super__Rb_tree_header._M_node_count = 0;
  pvStack_48 = (void *)0x0;
  local_40 = 0;
  lStack_38 = 0;
  local_120 = this;
  local_b8._M_impl._M_node.super__List_node_base._M_prev =
       local_b8._M_impl._M_node.super__List_node_base._M_next;
  local_90._M_impl._M_node.super__List_node_base._M_prev =
       local_90._M_impl._M_node.super__List_node_base._M_next;
  local_78._M_impl.super__Rb_tree_header._M_header._M_right =
       local_78._M_impl.super__Rb_tree_header._M_header._M_left;
  rVar8 = std::chrono::_V2::system_clock::now();
  paVar3 = &local_140.field_2;
  local_140._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_140,"c","");
  iVar9 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
          ::find(&parameters->_M_t,&local_140);
  p_Var1 = &(parameters->_M_t)._M_impl.super__Rb_tree_header;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_140._M_dataplus._M_p != paVar3) {
    operator_delete(local_140._M_dataplus._M_p,local_140.field_2._M_allocated_capacity + 1);
  }
  if ((_Rb_tree_header *)iVar9._M_node != p_Var1) {
    local_140._M_dataplus._M_p = (pointer)paVar3;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_140,"c","");
    pmVar10 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
              ::operator[](parameters,&local_140);
    local_168._M_dataplus._M_p = (pointer)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<boost::filesystem::path,std::allocator<boost::filesystem::path>,std::__cxx11::string&>
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_168._M_string_length,
               (path **)&local_168,(allocator<boost::filesystem::path> *)&local_169,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               ((pmVar10->
                super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl._M_node.super__List_node_base._M_next + 1));
    pkVar5 = pkStack_f0;
    pkStack_f0 = (key_type *)local_168._M_string_length;
    local_f8 = (path *)local_168._M_dataplus._M_p;
    local_168._M_dataplus._M_p = (pointer)0x0;
    local_168._M_string_length = 0;
    if (pkVar5 != (key_type *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pkVar5);
    }
    if ((key_type *)local_168._M_string_length != (key_type *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_168._M_string_length);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_140._M_dataplus._M_p != paVar3) {
      operator_delete(local_140._M_dataplus._M_p,local_140.field_2._M_allocated_capacity + 1);
    }
  }
  local_140._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_140,"o","");
  iVar9 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
          ::find(&parameters->_M_t,&local_140);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_140._M_dataplus._M_p != paVar3) {
    operator_delete(local_140._M_dataplus._M_p,local_140.field_2._M_allocated_capacity + 1);
  }
  if ((_Rb_tree_header *)iVar9._M_node != p_Var1) {
    local_140._M_dataplus._M_p = (pointer)paVar3;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_140,"o","");
    pmVar10 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
              ::operator[](parameters,&local_140);
    local_168._M_dataplus._M_p = (pointer)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<boost::filesystem::path,std::allocator<boost::filesystem::path>,std::__cxx11::string&>
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_168._M_string_length,
               (path **)&local_168,(allocator<boost::filesystem::path> *)&local_169,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               ((pmVar10->
                super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl._M_node.super__List_node_base._M_next + 1));
    pkVar5 = pkStack_e0;
    pkStack_e0 = (key_type *)local_168._M_string_length;
    local_e8 = local_168._M_dataplus._M_p;
    local_168._M_dataplus._M_p = (pointer)0x0;
    local_168._M_string_length = 0;
    if (pkVar5 != (key_type *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pkVar5);
    }
    if ((key_type *)local_168._M_string_length != (key_type *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_168._M_string_length);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_140._M_dataplus._M_p != paVar3) {
      operator_delete(local_140._M_dataplus._M_p,local_140.field_2._M_allocated_capacity + 1);
    }
  }
  local_118.__d.__r = (duration)(duration)rVar8;
  iVar6 = boost::filesystem::path::compare(local_f8);
  if (iVar6 == 0) {
    local_140._M_dataplus._M_p = (pointer)paVar3;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_140,"overwritecode","");
    iVar9 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
            ::find(&parameters->_M_t,&local_140);
    bVar13 = (_Rb_tree_header *)iVar9._M_node == p_Var1;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_140._M_dataplus._M_p != paVar3) {
      operator_delete(local_140._M_dataplus._M_p,local_140.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    bVar13 = false;
  }
  paVar3 = &local_168.field_2;
  local_168._M_dataplus._M_p = (pointer)paVar3;
  if (bVar13) {
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_168,
               "Warning: you attempt to overwrite your source code! Take --overwritecode as parameter to proceed."
               ,"");
    helper::log((helper *)&local_168,(double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da));
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_168._M_dataplus._M_p != paVar3) {
      operator_delete(local_168._M_dataplus._M_p,local_168.field_2._M_allocated_capacity + 1);
    }
    EVar11 = parameterError;
  }
  else {
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_168,"pl","");
    iVar9 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
            ::find(&parameters->_M_t,&local_168);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_168._M_dataplus._M_p != paVar3) {
      operator_delete(local_168._M_dataplus._M_p,local_168.field_2._M_allocated_capacity + 1);
    }
    if ((_Rb_tree_header *)iVar9._M_node != p_Var1) {
      local_d4[0] = 1;
    }
    local_168._M_dataplus._M_p = (pointer)paVar3;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_168,"pa","");
    iVar9 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
            ::find(&parameters->_M_t,&local_168);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_168._M_dataplus._M_p != paVar3) {
      operator_delete(local_168._M_dataplus._M_p,local_168.field_2._M_allocated_capacity + 1);
    }
    if ((_Rb_tree_header *)iVar9._M_node != p_Var1) {
      local_d4[1] = 1;
    }
    local_168._M_dataplus._M_p = (pointer)paVar3;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_168,"pi","");
    iVar9 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
            ::find(&parameters->_M_t,&local_168);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_168._M_dataplus._M_p != paVar3) {
      operator_delete(local_168._M_dataplus._M_p,local_168.field_2._M_allocated_capacity + 1);
    }
    if ((_Rb_tree_header *)iVar9._M_node != p_Var1) {
      local_d4[2] = 1;
    }
    local_168._M_dataplus._M_p = (pointer)paVar3;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_168,"pasm","");
    iVar9 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
            ::find(&parameters->_M_t,&local_168);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_168._M_dataplus._M_p != paVar3) {
      operator_delete(local_168._M_dataplus._M_p,local_168.field_2._M_allocated_capacity + 1);
    }
    if ((_Rb_tree_header *)iVar9._M_node != p_Var1) {
      local_d4[3] = 1;
    }
    local_168._M_dataplus._M_p = (pointer)&local_168;
    local_168.field_2._M_allocated_capacity = 0;
    plVar2 = &local_120->executables;
    EVar11 = success;
    p_Var12 = (_List_node_base *)plVar2;
    local_168._M_string_length = (size_type)local_168._M_dataplus._M_p;
    do {
      p_Var12 = (((_List_base<std::shared_ptr<nigel::BuilderExecutable>,_std::allocator<std::shared_ptr<nigel::BuilderExecutable>_>_>
                   *)&p_Var12->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
      if (p_Var12 == (_List_node_base *)plVar2) break;
      plVar4 = (long *)p_Var12[1]._M_next;
      this_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)p_Var12[1]._M_prev;
      if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          this_00->_M_use_count = this_00->_M_use_count + 1;
          UNLOCK();
        }
        else {
          this_00->_M_use_count = this_00->_M_use_count + 1;
        }
      }
      EVar7 = (**(code **)(*plVar4 + 0x10))(plVar4,&local_f8);
      std::__cxx11::
      list<std::shared_ptr<nigel::CompileNotification>,std::allocator<std::shared_ptr<nigel::CompileNotification>>>
      ::insert<std::_List_const_iterator<std::shared_ptr<nigel::CompileNotification>>,void>
                ((list<std::shared_ptr<nigel::CompileNotification>,std::allocator<std::shared_ptr<nigel::CompileNotification>>>
                  *)&local_168,(const_iterator)&local_168,(_List_node_base *)plVar4[1],
                 (_List_node_base *)(plVar4 + 1));
      if (EVar7 != success) {
        EVar11 = EVar7;
      }
      if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
      }
    } while (EVar7 == success);
    std::__cxx11::
    list<std::shared_ptr<nigel::CompileNotification>,_std::allocator<std::shared_ptr<nigel::CompileNotification>_>_>
    ::list((list<std::shared_ptr<nigel::CompileNotification>,_std::allocator<std::shared_ptr<nigel::CompileNotification>_>_>
            *)&local_110,
           (list<std::shared_ptr<nigel::CompileNotification>,_std::allocator<std::shared_ptr<nigel::CompileNotification>_>_>
            *)&local_168);
    printErrorLog(local_120,
                  (list<std::shared_ptr<nigel::CompileNotification>,_std::allocator<std::shared_ptr<nigel::CompileNotification>_>_>
                   *)&local_110,local_118);
    std::__cxx11::
    _List_base<std::shared_ptr<nigel::CompileNotification>,_std::allocator<std::shared_ptr<nigel::CompileNotification>_>_>
    ::_M_clear(&local_110);
    std::__cxx11::
    _List_base<std::shared_ptr<nigel::CompileNotification>,_std::allocator<std::shared_ptr<nigel::CompileNotification>_>_>
    ::_M_clear((_List_base<std::shared_ptr<nigel::CompileNotification>,_std::allocator<std::shared_ptr<nigel::CompileNotification>_>_>
                *)&local_168);
  }
  if (pvStack_48 != (void *)0x0) {
    operator_delete(pvStack_48,lStack_38 - (long)pvStack_48);
  }
  std::
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_std::shared_ptr<nigel::IM_Variable>_>,_std::_Select1st<std::pair<const_unsigned_int,_std::shared_ptr<nigel::IM_Variable>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::shared_ptr<nigel::IM_Variable>_>_>_>
  ::~_Rb_tree(&local_78);
  std::__cxx11::
  _List_base<std::shared_ptr<nigel::IM_Command>,_std::allocator<std::shared_ptr<nigel::IM_Command>_>_>
  ::_M_clear(&local_90);
  if (local_98 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_98);
  }
  std::__cxx11::
  _List_base<std::shared_ptr<nigel::Token>,_std::allocator<std::shared_ptr<nigel::Token>_>_>::
  _M_clear(&local_b8);
  std::vector<nigel::CodeBase::LineContent,_std::allocator<nigel::CodeBase::LineContent>_>::~vector
            ((vector<nigel::CodeBase::LineContent,_std::allocator<nigel::CodeBase::LineContent>_> *)
             (local_d4 + 4));
  if (pkStack_e0 != (key_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pkStack_e0);
  }
  if (pkStack_f0 != (key_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pkStack_f0);
  }
  return EVar11;
}

Assistant:

ExecutionResult BuilderTask::execute( std::map<String, std::list<String>> parameters, std::set<char> flags )
	{
		CodeBase codeBase;
		auto startTime = std::chrono::system_clock::now();

		if( parameters.find( "c" ) != parameters.end() ) codeBase.srcFile = std::make_shared<fs::path>( parameters["c"].front() );
		if( parameters.find( "o" ) != parameters.end() ) codeBase.destFile = std::make_shared<fs::path>( parameters["o"].front() );
		if( *codeBase.srcFile == *codeBase.destFile && parameters.find( "overwritecode" ) == parameters.end() )
		{
			log( "Warning: you attempt to overwrite your source code! Take --overwritecode as parameter to proceed.", LogLevel::Warning );
			return ExecutionResult::parameterError;
		}

		if( parameters.find( "pl" ) != parameters.end() ) codeBase.printLexer = true;
		if( parameters.find( "pa" ) != parameters.end() ) codeBase.printAST = true;
		if( parameters.find( "pi" ) != parameters.end() ) codeBase.printIMC = true;
		if( parameters.find( "pasm" ) != parameters.end() ) codeBase.printAssembly = true;

		std::list<std::shared_ptr<CompileNotification>> notificationList;
		ExecutionResult executionResult = ExecutionResult::success;

		for( auto e : executables )
		{
			ExecutionResult result = e->onExecute( codeBase );
			notificationList.insert( notificationList.end(), e->getNotifications().begin(), e->getNotifications().end() );
			if( result != ExecutionResult::success )
			{
				executionResult = result;
				break;
			}
		}

		printErrorLog( notificationList, startTime );
		return executionResult;
	}